

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::PrimitiveInstantiationSyntax::PrimitiveInstantiationSyntax
          (PrimitiveInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token type,
          NetStrengthSyntax *strength,TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  HierarchicalInstanceSyntax *pHVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> local_40;
  
  uVar5 = type._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PrimitiveInstantiation,attributes);
  (this->type).kind = (short)uVar5;
  (this->type).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->type).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->type).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->type).info = type.info;
  this->strength = strength;
  this->delay = delay;
  uVar3 = *(undefined4 *)&(instances->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (instances->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.kind =
       (instances->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->instances).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (instances->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->instances).super_SyntaxListBase.childCount = (instances->super_SyntaxListBase).childCount;
  (this->instances).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00b6ee68
  ;
  sVar1 = (instances->elements)._M_extent._M_extent_value;
  (this->instances).elements._M_ptr = (instances->elements)._M_ptr;
  (this->instances).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (strength != (NetStrengthSyntax *)0x0) {
    (strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (delay != (TimingControlSyntax *)0x0) {
    (delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_40.index = 0;
  sVar1 = (this->instances).elements._M_extent._M_extent_value;
  local_40.list = &this->instances;
  for (; (local_40.list != &this->instances || (local_40.index != sVar1 + 1 >> 1));
      local_40.index = local_40.index + 1) {
    pHVar4 = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
             iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>::dereference(&local_40);
    (pHVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PrimitiveInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token type, NetStrengthSyntax* strength, TimingControlSyntax* delay, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::PrimitiveInstantiation, attributes), type(type), strength(strength), delay(delay), instances(instances), semi(semi) {
        if (this->strength) this->strength->parent = this;
        if (this->delay) this->delay->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }